

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparators.cpp
# Opt level: O3

int duckdb::Comparators::TemplatedCompareListLoop<unsigned_int>
              (data_ptr_t *left_ptr,data_ptr_t *right_ptr,ValidityBytes *left_validity,
              ValidityBytes *right_validity,idx_t *count)

{
  uint uVar1;
  idx_t iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  iVar2 = *count;
  if (iVar2 == 0) {
    return 0;
  }
  uVar6 = 0;
  while( true ) {
    uVar5 = 0xff;
    uVar4 = 0xff;
    if (left_validity->validity_mask != (uchar *)0x0) {
      uVar4 = (uint)left_validity->validity_mask[uVar6 >> 3];
    }
    uVar3 = (uint)uVar6 & 7;
    uVar8 = 1 << (sbyte)uVar3;
    if (right_validity->validity_mask != (uchar *)0x0) {
      uVar5 = (uint)right_validity->validity_mask[uVar6 >> 3];
    }
    uVar1 = *(uint *)*left_ptr;
    uVar7 = -(uint)(uVar1 < *(uint *)*right_ptr) | 1;
    if (uVar1 == *(uint *)*right_ptr) {
      uVar7 = 0;
    }
    *left_ptr = (data_ptr_t)((long)*left_ptr + 4);
    *right_ptr = *right_ptr + 4;
    uVar3 = (uint)(((uVar5 | uVar4) >> uVar3 & 1) != 0);
    if ((uVar4 & uVar8) != 0) {
      uVar3 = -(uint)((uVar5 & uVar8) == 0) | uVar7;
    }
    if (uVar3 != 0) break;
    uVar6 = uVar6 + 1;
    if (iVar2 == uVar6) {
      return 0;
    }
  }
  return uVar3;
}

Assistant:

int Comparators::TemplatedCompareListLoop(data_ptr_t &left_ptr, data_ptr_t &right_ptr,
                                          const ValidityBytes &left_validity, const ValidityBytes &right_validity,
                                          const idx_t &count) {
	int comp_res = 0;
	bool left_valid;
	bool right_valid;
	idx_t entry_idx;
	idx_t idx_in_entry;
	for (idx_t i = 0; i < count; i++) {
		ValidityBytes::GetEntryIndex(i, entry_idx, idx_in_entry);
		left_valid = left_validity.RowIsValid(left_validity.GetValidityEntry(entry_idx), idx_in_entry);
		right_valid = right_validity.RowIsValid(right_validity.GetValidityEntry(entry_idx), idx_in_entry);
		comp_res = TemplatedCompareAndAdvance<T>(left_ptr, right_ptr);
		if (!left_valid && !right_valid) {
			comp_res = 0;
		} else if (!left_valid) {
			comp_res = 1;
		} else if (!right_valid) {
			comp_res = -1;
		}
		if (comp_res != 0) {
			break;
		}
	}
	return comp_res;
}